

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O0

void __thiscall Liby::TcpClient::start(TcpClient *this)

{
  bool bVar1;
  element_type *this_00;
  element_type *this_01;
  Channel *pCVar2;
  bool bVar3;
  enable_shared_from_this<Liby::TcpClient> local_98;
  anon_class_8_1_8991fb9c local_88;
  BasicHandler local_80;
  anon_class_8_1_8991fb9c local_50;
  BasicHandler local_48;
  int local_24;
  shared_ptr<Liby::Channel> local_20;
  TcpClient *local_10;
  TcpClient *this_local;
  
  bVar3 = false;
  local_10 = this;
  if (this->loop_ != (EventLoop *)0x0) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->socket_);
    bVar3 = false;
    if (bVar1) {
      bVar3 = this->poller_ != (Poller *)0x0;
    }
  }
  if (bVar3) {
    this_00 = std::__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->socket_);
    local_24 = Socket::fd(this_00);
    std::make_shared<Liby::Channel,Liby::Poller*&,int>((Poller **)&local_20,(int *)&this->poller_);
    std::shared_ptr<Liby::Channel>::operator=(&this->chan_,&local_20);
    std::shared_ptr<Liby::Channel>::~shared_ptr(&local_20);
    this_01 = std::__shared_ptr_access<Liby::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Liby::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->chan_);
    pCVar2 = Channel::enableRead(this_01,false);
    pCVar2 = Channel::enableWrit(pCVar2,true);
    local_50.this = this;
    std::function<void()>::function<Liby::TcpClient::start()::__0,void>
              ((function<void()> *)&local_48,&local_50);
    pCVar2 = Channel::onWrit(pCVar2,&local_48);
    local_88.this = this;
    std::function<void()>::function<Liby::TcpClient::start()::__1,void>
              ((function<void()> *)&local_80,&local_88);
    pCVar2 = Channel::onErro(pCVar2,&local_80);
    Channel::addChannel(pCVar2);
    std::function<void_()>::~function(&local_80);
    std::function<void_()>::~function(&local_48);
    std::enable_shared_from_this<Liby::TcpClient>::shared_from_this(&local_98);
    std::shared_ptr<Liby::TcpClient>::operator=
              (&this->self_,(shared_ptr<Liby::TcpClient> *)&local_98);
    std::shared_ptr<Liby::TcpClient>::~shared_ptr((shared_ptr<Liby::TcpClient> *)&local_98);
    return;
  }
  __assert_fail("loop_ && socket_ && poller_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpClient.cpp"
                ,0xf,"void Liby::TcpClient::start()");
}

Assistant:

void TcpClient::start() {
    //    assert(connector_);
    assert(loop_ && socket_ && poller_);
    chan_ = std::make_shared<Channel>(poller_, socket_->fd());
    chan_->enableRead(false)
        .enableWrit()
        .onWrit([this] {
            auto x = shared_from_this();
            //            if (!socket_) {
            //                auto p = chan_.get();
            //                socket_.reset();
            //            }
            ConnPtr connPtr = std::make_shared<Connection>(loop_, socket_);
            connPtr->setChannel(chan_);
            if (context_) {
                connPtr->context_ = context_;
            }
            Connector connector = connector_;

            loop_->nextTick([&, connPtr, connector] {
                chan_->onWrit(nullptr);
                chan_->onErro(nullptr);
                destroy();

                connPtr->init();
                connPtr->enableRead();
                if (connector) {
                    connector(connPtr);
                }
            });

            chan_->enableRead(false);
            chan_->enableWrit(false);
            chan_->updateChannel();
        })
        .onErro([this] {
            auto x = shared_from_this();
            if (connector_) {
                connector_(nullptr);
            }
            destroy();
        })
        .addChannel();
    self_ = shared_from_this();
}